

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_distinct_aggregator.cpp
# Opt level: O3

void __thiscall
duckdb::WindowDistinctAggregatorLocalState::Evaluate
          (WindowDistinctAggregatorLocalState *this,WindowDistinctAggregatorGlobalState *gdstate,
          DataChunk *bounds,Vector *result,idx_t count,idx_t row_idx)

{
  WindowDistinctSortTree *this_00;
  SubFrames *this_01;
  vector<unsigned_long,_true> *this_02;
  WindowExcludeMode WVar1;
  data_ptr_t pdVar2;
  data_ptr_t pdVar3;
  data_ptr_t pdVar4;
  data_ptr_t pdVar5;
  data_ptr_t pdVar6;
  data_ptr_t pdVar7;
  ulong uVar8;
  value_type vVar9;
  idx_t iVar10;
  pointer puVar11;
  idx_t iVar12;
  bool bVar13;
  const_reference pvVar14;
  reference pvVar15;
  ulong uVar16;
  const_reference pvVar17;
  ulong uVar18;
  unsigned_long uVar19;
  vector<unsigned_long,_true> *this_03;
  unsigned_long uVar20;
  const_reference pvVar21;
  pointer puVar22;
  ulong uVar23;
  idx_t iVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  ulong *puVar28;
  pointer puVar29;
  size_type __n;
  WindowAggregateStates *this_04;
  ulong *puVar30;
  idx_t run_begin;
  ulong uVar31;
  ulong uVar32;
  unsigned_long run_begin_1;
  ulong uVar33;
  size_type sVar34;
  size_type __n_00;
  ulong local_f0;
  size_type local_a8;
  
  pdVar2 = (this->statep).data;
  pdVar3 = (this->statel).data;
  WVar1 = ((gdstate->super_WindowAggregatorGlobalState).aggregator)->exclude_mode;
  this_04 = &this->statef;
  WindowAggregateStates::Initialize(this_04,count);
  pvVar14 = vector<duckdb::Vector,_true>::operator[](&bounds->data,6);
  pdVar4 = pvVar14->data;
  pvVar14 = vector<duckdb::Vector,_true>::operator[](&bounds->data,7);
  pdVar5 = pvVar14->data;
  pvVar14 = vector<duckdb::Vector,_true>::operator[](&bounds->data,2);
  pdVar6 = pvVar14->data;
  pvVar14 = vector<duckdb::Vector,_true>::operator[](&bounds->data,3);
  if (count != 0) {
    this_00 = &gdstate->merge_sort_tree;
    this_01 = &this->frames;
    pdVar7 = pvVar14->data;
    this_02 = &gdstate->levels_flat_start;
    iVar24 = 0;
    do {
      uVar32 = *(ulong *)(pdVar4 + iVar24 * 8);
      uVar8 = *(ulong *)(pdVar5 + iVar24 * 8);
      if (WVar1 == NO_OTHER) {
        __n = 0;
      }
      else {
        uVar16 = row_idx;
        if (WVar1 != CURRENT_ROW) {
          uVar16 = *(ulong *)(pdVar6 + iVar24 * 8);
        }
        if (uVar8 <= uVar16) {
          uVar16 = uVar8;
        }
        if (uVar16 <= uVar32) {
          uVar16 = uVar32;
        }
        pvVar15 = vector<duckdb::FrameBounds,_true>::operator[](this_01,0);
        pvVar15->start = uVar32;
        pvVar15->end = uVar16;
        if (WVar1 == TIES) {
          uVar16 = uVar32;
          if (uVar32 < row_idx) {
            uVar16 = row_idx;
          }
          if (uVar8 <= uVar16) {
            uVar16 = uVar8;
          }
          uVar18 = row_idx + 1;
          if (uVar8 <= row_idx + 1) {
            uVar18 = uVar8;
          }
          if (uVar18 <= uVar32) {
            uVar18 = uVar32;
          }
          pvVar15 = vector<duckdb::FrameBounds,_true>::operator[](this_01,1);
          pvVar15->start = uVar16;
          pvVar15->end = uVar18;
          __n = 2;
LAB_0119d1c3:
          uVar16 = *(ulong *)(pdVar7 + iVar24 * 8);
        }
        else {
          __n = 1;
          if (WVar1 != CURRENT_ROW) goto LAB_0119d1c3;
          uVar16 = row_idx + 1;
        }
        if (uVar32 < uVar16) {
          uVar32 = uVar16;
        }
        if (uVar8 <= uVar32) {
          uVar32 = uVar8;
        }
      }
      pvVar15 = vector<duckdb::FrameBounds,_true>::operator[](this_01,__n);
      pvVar15->start = uVar32;
      pvVar15->end = uVar8;
      puVar22 = (this->statef).states.super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start + (this->statef).state_size * iVar24;
      pvVar15 = vector<duckdb::FrameBounds,_true>::operator[](this_01,0);
      uVar32 = pvVar15->start;
      pvVar15 = vector<duckdb::FrameBounds,_true>::operator[](this_01,0);
      uVar8 = pvVar15->end;
      if (uVar32 < uVar8) {
        uVar16 = uVar32 + 1;
        if (uVar8 - 1 == uVar32) {
          pvVar17 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                  *)this_00,0);
          puVar29 = (pvVar17->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          uVar18 = uVar32;
        }
        else {
          uVar31 = 1;
          sVar34 = 0;
          uVar18 = uVar8 - 1;
          uVar33 = uVar32;
          do {
            uVar23 = uVar18;
            uVar33 = uVar33 >> 5;
            uVar31 = uVar31 * 0x20;
            sVar34 = sVar34 + 1;
            uVar18 = uVar23 >> 5;
          } while (uVar33 != uVar23 >> 5);
          uVar18 = uVar31 * uVar23 >> 5;
          local_f0 = uVar18;
          if (2 < sVar34) {
            uVar33 = uVar33 * uVar31;
            pvVar17 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                    *)this_00,0);
            uVar26 = (long)(pvVar17->first).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_finish -
                     (long)(pvVar17->first).
                           super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
                           .super__Vector_impl_data._M_start >> 3;
            if (uVar33 + uVar31 <= uVar26) {
              uVar26 = uVar33 + uVar31;
            }
            pvVar17 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                      ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                    *)this_00,sVar34);
            puVar29 = (pvVar17->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar28 = puVar29 + uVar33;
            uVar27 = uVar26 - uVar33;
            if (uVar27 != 0 && (long)uVar33 <= (long)uVar26) {
              do {
                uVar26 = uVar27 >> 1;
                uVar25 = ~uVar26 + uVar27;
                uVar27 = uVar26;
                if (puVar28[uVar26] < uVar16) {
                  puVar28 = puVar28 + uVar26 + 1;
                  uVar27 = uVar25;
                }
              } while (0 < (long)uVar27);
            }
            uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                               ((long)puVar28 - (long)puVar29 >> 3);
            uVar33 = (uVar33 / uVar31) * 0x40 + (uVar19 & 0xffffffffffffffe0);
            local_a8 = (uVar23 | 0xffffffffffffffe0) + uVar33;
            __n_00 = (uint)uVar23 & 0x1f | uVar33;
            uVar33 = sVar34;
            do {
              sVar34 = uVar33 - 1;
              uVar31 = uVar31 >> 5;
              pvVar17 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                        ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                      *)this_00,sVar34);
              puVar29 = (pvVar17->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                        .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              pvVar17 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                        ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                      *)this_00,uVar33);
              this_03 = &pvVar17->second;
              local_a8 = local_a8 + 0x1f;
              uVar23 = local_f0 - uVar32;
              while (uVar31 <= uVar23) {
                pvVar21 = vector<unsigned_long,_true>::operator[](this_03,local_a8);
                vVar9 = *pvVar21;
                puVar28 = puVar29 + vVar9;
                pvVar21 = vector<unsigned_long,_true>::operator[](this_03,local_a8 + 0x20);
                uVar23 = *pvVar21 - vVar9;
                if (uVar23 != 0 && (long)vVar9 <= (long)*pvVar21) {
                  do {
                    uVar26 = uVar23 >> 1;
                    uVar27 = ~uVar26 + uVar23;
                    uVar23 = uVar26;
                    if (puVar28[uVar26] < uVar16) {
                      puVar28 = puVar28 + uVar26 + 1;
                      uVar23 = uVar27;
                    }
                  } while (0 < (long)uVar23);
                }
                local_f0 = local_f0 - uVar31;
                uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                   ((long)puVar28 - (long)puVar29 >> 3);
                if (uVar19 != local_f0) {
                  pvVar21 = vector<unsigned_long,_true>::operator[](this_02,sVar34);
                  vVar9 = *pvVar21;
                  iVar10 = (gdstate->levels_flat_native).state_size;
                  puVar11 = (gdstate->levels_flat_native).states.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar12 = this->flush_count;
                  *(pointer *)(pdVar2 + iVar12 * 8) = puVar22;
                  this->flush_count = iVar12 + 1;
                  *(pointer *)(pdVar3 + iVar12 * 8) = puVar11 + (vVar9 + uVar19 + -1) * iVar10;
                  if (0x7ff < iVar12 + 1) {
                    FlushStates(this);
                  }
                }
                local_a8 = local_a8 - 1;
                uVar23 = local_f0 - uVar32;
              }
              if (local_f0 != uVar32) {
                pvVar21 = vector<unsigned_long,_true>::operator[](this_03,local_a8);
                vVar9 = *pvVar21;
                puVar28 = puVar29 + vVar9;
                pvVar21 = vector<unsigned_long,_true>::operator[](this_03,local_a8 + 0x20);
                uVar23 = *pvVar21 - vVar9;
                if (uVar23 != 0 && (long)vVar9 <= (long)*pvVar21) {
                  do {
                    uVar26 = uVar23 >> 1;
                    uVar27 = ~uVar26 + uVar23;
                    uVar23 = uVar26;
                    if (puVar28[uVar26] < uVar16) {
                      puVar28 = puVar28 + uVar26 + 1;
                      uVar23 = uVar27;
                    }
                  } while (0 < (long)uVar23);
                }
                uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                   ((long)puVar28 - (long)puVar29 >> 3);
                local_a8 = (uVar32 / uVar31) * 0x40 + (uVar19 & 0xffffffffffffffe0);
              }
              for (; uVar31 <= uVar8 - uVar18; uVar18 = uVar18 + uVar31) {
                pvVar21 = vector<unsigned_long,_true>::operator[](this_03,__n_00);
                vVar9 = *pvVar21;
                puVar28 = puVar29 + vVar9;
                pvVar21 = vector<unsigned_long,_true>::operator[](this_03,__n_00 + 0x20);
                uVar23 = *pvVar21 - vVar9;
                if (uVar23 != 0 && (long)vVar9 <= (long)*pvVar21) {
                  do {
                    uVar26 = uVar23 >> 1;
                    uVar27 = ~uVar26 + uVar23;
                    uVar23 = uVar26;
                    if (puVar28[uVar26] < uVar16) {
                      puVar28 = puVar28 + uVar26 + 1;
                      uVar23 = uVar27;
                    }
                  } while (0 < (long)uVar23);
                }
                uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                   ((long)puVar28 - (long)puVar29 >> 3);
                if (uVar19 != uVar18) {
                  pvVar21 = vector<unsigned_long,_true>::operator[](this_02,sVar34);
                  vVar9 = *pvVar21;
                  iVar10 = (gdstate->levels_flat_native).state_size;
                  puVar11 = (gdstate->levels_flat_native).states.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar12 = this->flush_count;
                  *(pointer *)(pdVar2 + iVar12 * 8) = puVar22;
                  this->flush_count = iVar12 + 1;
                  *(pointer *)(pdVar3 + iVar12 * 8) = puVar11 + (vVar9 + uVar19 + -1) * iVar10;
                  if (0x7ff < iVar12 + 1) {
                    FlushStates(this);
                  }
                }
                __n_00 = __n_00 + 1;
              }
              if (uVar18 != uVar8) {
                pvVar21 = vector<unsigned_long,_true>::operator[](this_03,__n_00);
                vVar9 = *pvVar21;
                puVar28 = puVar29 + vVar9;
                pvVar21 = vector<unsigned_long,_true>::operator[](this_03,__n_00 + 0x20);
                uVar23 = *pvVar21 - vVar9;
                if (uVar23 != 0 && (long)vVar9 <= (long)*pvVar21) {
                  do {
                    uVar26 = uVar23 >> 1;
                    uVar27 = ~uVar26 + uVar23;
                    uVar23 = uVar26;
                    if (puVar28[uVar26] < uVar16) {
                      puVar28 = puVar28 + uVar26 + 1;
                      uVar23 = uVar27;
                    }
                  } while (0 < (long)uVar23);
                }
                uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                   ((long)puVar28 - (long)puVar29 >> 3);
                __n_00 = (uVar8 / uVar31) * 0x40 + (uVar19 & 0xffffffffffffffe0);
              }
              bVar13 = 2 < uVar33;
              uVar33 = sVar34;
            } while (bVar13);
          }
          if (1 < sVar34) {
            sVar34 = sVar34 - 1;
            do {
              uVar23 = uVar31 >> 5;
              pvVar17 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                        ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                      *)this_00,sVar34);
              puVar29 = (pvVar17->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>
                        .super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              uVar33 = local_f0 - uVar32;
              while (uVar23 <= uVar33) {
                puVar28 = puVar29 + (local_f0 - uVar23);
                uVar33 = uVar23;
                puVar30 = puVar28;
                if (0x1f < uVar31) {
                  do {
                    uVar26 = uVar33 >> 1;
                    if (puVar30[uVar26] < uVar16) {
                      puVar30 = puVar30 + uVar26 + 1;
                      uVar26 = ~uVar26 + uVar33;
                    }
                    uVar33 = uVar26;
                  } while (0 < (long)uVar26);
                }
                uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                   ((long)puVar30 - (long)puVar29 >> 3);
                uVar20 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                   ((long)puVar28 - (long)puVar29 >> 3);
                if (uVar19 != uVar20) {
                  pvVar21 = vector<unsigned_long,_true>::operator[](this_02,sVar34);
                  vVar9 = *pvVar21;
                  iVar10 = (gdstate->levels_flat_native).state_size;
                  puVar11 = (gdstate->levels_flat_native).states.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar12 = this->flush_count;
                  *(pointer *)(pdVar2 + iVar12 * 8) = puVar22;
                  this->flush_count = iVar12 + 1;
                  *(pointer *)(pdVar3 + iVar12 * 8) = puVar11 + (vVar9 + uVar19 + -1) * iVar10;
                  if (0x7ff < iVar12 + 1) {
                    FlushStates(this);
                  }
                }
                local_f0 = local_f0 - uVar23;
                uVar33 = local_f0 - uVar32;
              }
              for (; uVar23 <= uVar8 - uVar18; uVar18 = uVar18 + uVar23) {
                puVar28 = puVar29 + uVar18;
                uVar31 = uVar23;
                do {
                  uVar33 = uVar31 >> 1;
                  uVar26 = ~uVar33 + uVar31;
                  uVar31 = uVar33;
                  if (puVar28[uVar33] < uVar16) {
                    puVar28 = puVar28 + uVar33 + 1;
                    uVar31 = uVar26;
                  }
                } while (0 < (long)uVar31);
                uVar19 = NumericCastImpl<unsigned_long,_long,_false>::Convert
                                   ((long)puVar28 - (long)puVar29 >> 3);
                uVar20 = NumericCastImpl<unsigned_long,_long,_false>::Convert(uVar18);
                if (uVar19 != uVar20) {
                  pvVar21 = vector<unsigned_long,_true>::operator[](this_02,sVar34);
                  vVar9 = *pvVar21;
                  iVar10 = (gdstate->levels_flat_native).state_size;
                  puVar11 = (gdstate->levels_flat_native).states.
                            super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar12 = this->flush_count;
                  *(pointer *)(pdVar2 + iVar12 * 8) = puVar22;
                  this->flush_count = iVar12 + 1;
                  *(pointer *)(pdVar3 + iVar12 * 8) = puVar11 + (vVar9 + uVar19 + -1) * iVar10;
                  if (0x7ff < iVar12 + 1) {
                    FlushStates(this);
                  }
                }
              }
              sVar34 = sVar34 - 1;
              uVar31 = uVar23;
            } while (sVar34 != 0);
          }
          pvVar17 = vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                    ::operator[]((vector<std::pair<duckdb::vector<unsigned_long,_true>,_duckdb::vector<unsigned_long,_true>_>,_true>
                                  *)this_00,0);
          puVar29 = (pvVar17->first).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start;
          for (; local_f0 != uVar32; uVar32 = uVar32 + 1) {
            if (puVar29[uVar32] < uVar16) {
              pvVar21 = vector<unsigned_long,_true>::operator[](this_02,0);
              vVar9 = *pvVar21;
              iVar10 = (gdstate->levels_flat_native).state_size;
              puVar11 = (gdstate->levels_flat_native).states.
                        super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start;
              iVar12 = this->flush_count;
              *(pointer *)(pdVar2 + iVar12 * 8) = puVar22;
              this->flush_count = iVar12 + 1;
              *(pointer *)(pdVar3 + iVar12 * 8) = puVar11 + (vVar9 + uVar32) * iVar10;
              if (0x7ff < iVar12 + 1) {
                FlushStates(this);
              }
            }
          }
        }
        for (; uVar18 != uVar8; uVar18 = uVar18 + 1) {
          if (puVar29[uVar18] < uVar16) {
            pvVar21 = vector<unsigned_long,_true>::operator[](this_02,0);
            vVar9 = *pvVar21;
            iVar10 = (gdstate->levels_flat_native).state_size;
            puVar11 = (gdstate->levels_flat_native).states.
                      super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start;
            iVar12 = this->flush_count;
            *(pointer *)(pdVar2 + iVar12 * 8) = puVar22;
            this->flush_count = iVar12 + 1;
            *(pointer *)(pdVar3 + iVar12 * 8) = puVar11 + (vVar9 + uVar18) * iVar10;
            if (0x7ff < iVar12 + 1) {
              FlushStates(this);
            }
          }
        }
      }
      iVar24 = iVar24 + 1;
      row_idx = row_idx + 1;
    } while (iVar24 != count);
  }
  FlushStates(this);
  WindowAggregateStates::Finalize(this_04,result);
  WindowAggregateStates::Destroy(this_04);
  return;
}

Assistant:

void WindowDistinctAggregatorLocalState::Evaluate(const WindowDistinctAggregatorGlobalState &gdstate,
                                                  const DataChunk &bounds, Vector &result, idx_t count, idx_t row_idx) {
	auto ldata = FlatVector::GetData<const_data_ptr_t>(statel);
	auto pdata = FlatVector::GetData<data_ptr_t>(statep);

	const auto &merge_sort_tree = gdstate.merge_sort_tree;
	const auto &levels_flat_native = gdstate.levels_flat_native;
	const auto exclude_mode = gdstate.aggregator.exclude_mode;

	//	Build the finalise vector that just points to the result states
	statef.Initialize(count);

	WindowAggregator::EvaluateSubFrames(bounds, exclude_mode, count, row_idx, frames, [&](idx_t rid) {
		auto agg_state = statef.GetStatePtr(rid);

		//	TODO: Extend AggregateLowerBound to handle subframes, just like SelectNth.
		const auto lower = frames[0].start;
		const auto upper = frames[0].end;
		merge_sort_tree.AggregateLowerBound(lower, upper, lower + 1,
		                                    [&](idx_t level, const idx_t run_begin, const idx_t run_pos) {
			                                    if (run_pos != run_begin) {
				                                    //	Find the source aggregate
				                                    // Buffer a merge of the indicated state into the current state
				                                    const auto agg_idx = gdstate.levels_flat_start[level] + run_pos - 1;
				                                    const auto running_agg = levels_flat_native.GetStatePtr(agg_idx);
				                                    pdata[flush_count] = agg_state;
				                                    ldata[flush_count++] = running_agg;
				                                    if (flush_count >= STANDARD_VECTOR_SIZE) {
					                                    FlushStates();
				                                    }
			                                    }
		                                    });
	});

	//	Flush the final states
	FlushStates();

	//	Finalise the result aggregates and write to the result
	statef.Finalize(result);

	//	Destruct any non-POD state
	statef.Destroy();
}